

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<int,phmap::test_internal::MovableOnlyInstance>::
     construct<std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>>
               (allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_> *alloc,
               slot_type *slot,slot_type *other)

{
  slot_type *other_local;
  slot_type *slot_local;
  allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_> *alloc_local;
  
  map_slot_policy<int,_phmap::test_internal::MovableOnlyInstance>::emplace(slot);
  allocator_traits<std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>>::
  construct<std::pair<int,phmap::test_internal::MovableOnlyInstance>,std::pair<int,phmap::test_internal::MovableOnlyInstance>>
            (alloc,(pair<int,_phmap::test_internal::MovableOnlyInstance> *)&slot->value,
             (pair<int,_phmap::test_internal::MovableOnlyInstance> *)&other->value);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, slot_type* other) {
        emplace(slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &slot->mutable_value, std::move(other->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                         std::move(other->value));
        }
    }